

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double calc_kurtosis<double,unsigned_long,double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,
                 unsigned_long *Xc_ind,unsigned_long *Xc_indptr,MissingAction missing_action)

{
  unsigned_long *puVar1;
  ulong *puVar2;
  unsigned_long uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  ulong uVar7;
  unsigned_long *puVar8;
  unsigned_long *puVar9;
  long lVar10;
  unsigned_long uVar11;
  ulong *puVar12;
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double local_c8;
  double local_c0;
  double local_a0;
  double local_98;
  ulong local_90;
  
  uVar11 = Xc_indptr[col_num];
  uVar3 = Xc_indptr[col_num + 1];
  if ((uVar11 == uVar3) || (uVar7 = (end - st) + 1, uVar7 < 2)) {
    return -INFINITY;
  }
  puVar1 = Xc_ind + uVar3;
  uVar4 = puVar1[-1];
  puVar12 = ix_arr + end + 1;
  puVar8 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                     (ix_arr + st,puVar12,Xc_ind + uVar11);
  local_c0 = 0.0;
  if (missing_action == Fail) {
    local_98 = 0.0;
    local_a0 = 0.0;
    local_c8 = 0.0;
LAB_001fdc4b:
    do {
      puVar2 = Xc_ind + uVar11;
      while( true ) {
        if (((puVar8 == puVar12) || (uVar11 == uVar3)) || (uVar5 = *puVar8, uVar4 < uVar5))
        goto LAB_001fde0b;
        if (*puVar2 == uVar5) {
          dVar15 = Xc[uVar11];
          dVar14 = dVar15 * dVar15;
          local_c0 = local_c0 + dVar15;
          local_c8 = fma(dVar15,dVar15,local_c8);
          local_a0 = fma(dVar14,dVar15,local_a0);
          local_98 = fma(dVar14,dVar14,local_98);
          if ((puVar8 == ix_arr + end) || (uVar11 == uVar3 - 1)) goto LAB_001fde0b;
          puVar8 = puVar8 + 1;
          puVar9 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                             (puVar2 + 1,puVar1,puVar8);
          uVar11 = (long)puVar9 - (long)Xc_ind >> 3;
          goto LAB_001fdc4b;
        }
        if (*puVar2 <= uVar5) break;
        puVar8 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                           (puVar8 + 1,puVar12,puVar2);
      }
      puVar9 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                         (puVar2 + 1,puVar1,puVar8);
      uVar11 = (long)puVar9 - (long)Xc_ind >> 3;
    } while( true );
  }
  local_98 = 0.0;
  local_a0 = 0.0;
  local_c8 = 0.0;
  local_c0 = 0.0;
  local_90 = uVar7;
LAB_001fdab1:
  puVar2 = Xc_ind + uVar11;
  do {
    if (((puVar8 == puVar12) || (uVar11 == uVar3)) || (uVar5 = *puVar8, uVar4 < uVar5)) {
LAB_001fddd8:
      lVar10 = uVar7 - Xc_indptr[col_num + 1];
      uVar7 = local_90;
      if (lVar10 + Xc_indptr[col_num] < local_90) {
LAB_001fde0b:
        if ((1 < uVar7) && ((local_c8 != 0.0 || (NAN(local_c8))))) {
          if ((local_c8 != local_c0 * local_c0) || (NAN(local_c8) || NAN(local_c0 * local_c0))) {
            auVar13._8_4_ = (int)(uVar7 >> 0x20);
            auVar13._0_8_ = uVar7;
            auVar13._12_4_ = 0x45300000;
            dVar14 = (auVar13._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0);
            dVar17 = local_c0 / dVar14;
            dVar15 = dVar17 * dVar17;
            dVar16 = local_c8 / dVar14 - dVar15;
            if ((!NAN(dVar16)) &&
               ((2.220446049250313e-16 < dVar16 ||
                (bVar6 = check_more_than_two_unique_values<double,unsigned_long>
                                   (ix_arr,st,end,col_num,Xc_indptr,Xc_ind,Xc,missing_action), bVar6
                )))) {
              if (dVar16 <= 0.0) {
                return 0.0;
              }
              dVar15 = (dVar15 * dVar17 * dVar17 * dVar14 +
                       local_c0 * -4.0 * dVar15 * dVar17 +
                       local_c8 * 6.0 * dVar15 + local_a0 * -4.0 * dVar17 + local_98) /
                       (dVar16 * dVar16 * dVar14);
              if (0x7fefffffffffffff < (long)ABS(dVar15)) {
                return -INFINITY;
              }
              if (0.0 < dVar15) {
                return dVar15;
              }
              return 0.0;
            }
          }
        }
      }
      return -INFINITY;
    }
    if (*puVar2 == uVar5) {
      dVar15 = Xc[uVar11];
      if ((ulong)ABS(dVar15) < 0x7ff0000000000000) {
        dVar14 = dVar15 * dVar15;
        local_c0 = local_c0 + dVar15;
        local_c8 = fma(dVar15,dVar15,local_c8);
        local_a0 = fma(dVar14,dVar15,local_a0);
        local_98 = fma(dVar14,dVar14,local_98);
      }
      else {
        local_90 = local_90 - 1;
      }
      if ((puVar8 == ix_arr + end) || (uVar11 == uVar3 - 1)) goto LAB_001fddd8;
      puVar8 = puVar8 + 1;
      puVar9 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                         (puVar2 + 1,puVar1,puVar8);
      uVar11 = (long)puVar9 - (long)Xc_ind >> 3;
      goto LAB_001fdab1;
    }
    if (*puVar2 <= uVar5) break;
    puVar8 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                       (puVar8 + 1,puVar12,puVar2);
  } while( true );
  puVar9 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                     (puVar2 + 1,puVar1,puVar8);
  uVar11 = (long)puVar9 - (long)Xc_ind >> 3;
  goto LAB_001fdab1;
}

Assistant:

double calc_kurtosis(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                     real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                     MissingAction missing_action)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    size_t cnt = end - st + 1;

    if (unlikely(cnt <= 1)) return -HUGE_VAL;
    
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                xval = Xc[curr_pos];
                if (unlikely(is_na_or_inf(xval)))
                {
                    cnt--;
                }

                else
                {
                    /* TODO: is it safe to use FMA here? some calculations rely on assuming that
                       some of these 's' are larger than the others. Would this procedure be guaranteed
                       to preserve such differences if done with a mixture of sums and FMAs? */
                    x_sq = square(xval);
                    s1 += xval;
                    s2  = std::fma(xval, xval, s2);
                    s3  = std::fma(x_sq, xval, s3);
                    s4  = std::fma(x_sq, x_sq, s4);
                    // s1 += pw1(xval);
                    // s2 += pw2(xval);
                    // s3 += pw3(xval);
                    // s4 += pw4(xval);
                }

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

        if (unlikely(cnt <= (end - st + 1) - (Xc_indptr[col_num+1] - Xc_indptr[col_num]))) return -HUGE_VAL;
    }

    else
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                xval = Xc[curr_pos];
                x_sq = square(xval);
                s1 += xval;
                s2  = std::fma(xval, xval, s2);
                s3  = std::fma(x_sq, xval, s3);
                s4  = std::fma(x_sq, x_sq, s4);
                // s1 += pw1(xval);
                // s2 += pw2(xval);
                // s3 += pw3(xval);
                // s4 += pw4(xval);

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe cnt_l = (ldouble_safe) cnt;
    ldouble_safe sn = s1 / cnt_l;
    ldouble_safe v  = s2 / cnt_l - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(ix_arr, st, end, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (unlikely(v <= 0)) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt_l * pw4(sn)) / (cnt_l * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}